

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

bool __thiscall IR::Opnd::IsWriteBarrierTriggerableValue(Opnd *this)

{
  bool bVar1;
  undefined8 in_RAX;
  AddrOpnd *pAVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  bVar1 = IsTaggedValue(this);
  if ((!bVar1) && (TySize[this->m_type] == 8)) {
    if ((DAT_0145c43e == '\x01') && (DAT_0145c43f != '\0')) {
      return true;
    }
    if ((this->m_kind != OpndKindAddr) ||
       (pAVar2 = AsAddrOpnd(this), pAVar2->addrOpndKind != AddrOpndKindDynamicVar)) {
      uStack_18._0_4_ = CONCAT22((this->m_valueType).field_0.bits,(undefined2)uStack_18);
      bVar1 = ValueType::IsBoolean((ValueType *)((long)&uStack_18 + 2));
      if (!bVar1) {
        uStack_18._0_6_ = CONCAT24((this->m_valueType).field_0.bits,(undefined4)uStack_18);
        bVar1 = ValueType::IsNull((ValueType *)((long)&uStack_18 + 4));
        if (!bVar1) {
          uStack_18 = CONCAT26((this->m_valueType).field_0.bits,(undefined6)uStack_18);
          bVar1 = ValueType::IsUndefined((ValueType *)((long)&uStack_18 + 6));
          return !bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool
Opnd::IsWriteBarrierTriggerableValue()
{
    // Determines whether if an operand is used as a source in a store instruction, whether the store needs a write barrier

    // If it's a tagged value, we don't need a write barrier
    if (this->IsTaggedValue())
    {
        return false;
    }

    if (TySize[this->GetType()] != sizeof(void*))
    {
        return false;
    }

#if DBG
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
    {
        return true; // No further optimization if we are in verification
    }
#endif

    // If this operand is known address, then it doesn't need a write barrier, the address is either not a GC address or is pinned
    if (this->IsAddrOpnd() && this->AsAddrOpnd()->GetAddrOpndKind() == AddrOpndKindDynamicVar)
    {
        return false;
    }

    // If its null/boolean/undefined, we don't need a write barrier since the javascript library will keep those guys alive
    return !(this->GetValueType().IsBoolean() || this->GetValueType().IsNull() || this->GetValueType().IsUndefined());
}